

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O1

void framebuffer_size_callback(GLFWwindow *window,int width,int height)

{
  mat4x4 projection;
  float local_58 [18];
  
  (*glad_glViewport)(0,0,width,height);
  (*glad_glMatrixMode)(0x1701);
  local_58[0] = 1.7320509;
  if (0 < height) {
    local_58[0] = 1.7320509 / ((float)width / (float)height);
  }
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  local_58[4] = 0.0;
  local_58[5] = 1.7320509;
  local_58[6] = 0.0;
  local_58[7] = 0.0;
  local_58[8] = 0.0;
  local_58[9] = 0.0;
  local_58[10] = -1.001955;
  local_58[0xb] = -1.0;
  local_58[0xc] = 0.0;
  local_58[0xd] = 0.0;
  local_58[0xe] = -2.001955;
  local_58[0xf] = 0.0;
  (*glad_glLoadMatrixf)(local_58);
  return;
}

Assistant:

void framebuffer_size_callback(GLFWwindow* window, int width, int height)
{
    float ratio = 1.f;
    mat4x4 projection;

    if (height > 0)
        ratio = (float) width / (float) height;

    // Setup viewport
    glViewport(0, 0, width, height);

    // Change to the projection matrix and set our viewing volume
    glMatrixMode(GL_PROJECTION);
    mat4x4_perspective(projection,
                       60.f * (float) M_PI / 180.f,
                       ratio,
                       1.f, 1024.f);
    glLoadMatrixf((const GLfloat*) projection);
}